

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::MoveIfCurrentTargetIsLocal(SQCompiler *this)

{
  SQFuncState *this_00;
  undefined2 uVar1;
  bool bVar2;
  SQUnsignedInteger stkpos;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInstruction local_18;
  
  stkpos = SQFuncState::TopTarget(this->_fs);
  bVar2 = SQFuncState::IsLocal(this->_fs,stkpos);
  if (bVar2) {
    SVar3 = SQFuncState::PopTarget(this->_fs);
    this_00 = this->_fs;
    SVar4 = SQFuncState::PushTarget(this_00,-1);
    local_18._arg0 = (uchar)SVar4;
    local_18._0_5_ = 0xa00000000;
    uVar1 = local_18._4_2_;
    local_18.op = (char)uVar1;
    local_18._arg0 = (char)((ushort)uVar1 >> 8);
    local_18._arg1 = (int)SVar3;
    local_18._arg2 = '\0';
    local_18._arg3 = '\0';
    SQFuncState::AddInstruction(this_00,&local_18);
  }
  return;
}

Assistant:

void MoveIfCurrentTargetIsLocal() {
        SQInteger trg = _fs->TopTarget();
        if(_fs->IsLocal(trg)) {
            trg = _fs->PopTarget(); //pops the target and moves it
            _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), trg);
        }
    }